

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_multigrad
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *grad,REF_INT p_norm,REF_DBL gradation,
          REF_DBL target_complexity)

{
  size_t __size;
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  REF_NODE pRVar5;
  double dVar6;
  uint uVar7;
  REF_DBL *scalar;
  long lVar8;
  REF_DBL *grad_00;
  ulong uVar9;
  REF_DBL *grad_01;
  REF_DBL *grad_02;
  REF_DBL *pRVar10;
  undefined8 uVar11;
  ulong uVar12;
  REF_STATUS RVar13;
  long lVar14;
  char *pcVar15;
  
  pRVar5 = ref_grid->node;
  iVar4 = pRVar5->max;
  lVar14 = (long)iVar4;
  if (lVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x996,
           "ref_metric_multigrad","malloc dsdx of REF_DBL negative");
    RVar13 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(lVar14 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar15 = "malloc dsdx of REF_DBL NULL";
      uVar11 = 0x996;
    }
    else {
      for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
        scalar[lVar8] = 0.0;
      }
      uVar7 = iVar4 * 3;
      __size = (ulong)uVar7 * 8;
      grad_00 = (REF_DBL *)malloc(__size);
      if (grad_00 == (REF_DBL *)0x0) {
        pcVar15 = "malloc gradx of REF_DBL NULL";
        uVar11 = 0x997;
      }
      else {
        uVar12 = (ulong)uVar7;
        for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
          grad_00[uVar9] = 0.0;
        }
        grad_01 = (REF_DBL *)malloc(__size);
        if (grad_01 == (REF_DBL *)0x0) {
          pcVar15 = "malloc grady of REF_DBL NULL";
          uVar11 = 0x998;
        }
        else {
          for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
            grad_01[uVar9] = 0.0;
          }
          grad_02 = (REF_DBL *)malloc(__size);
          if (grad_02 != (REF_DBL *)0x0) {
            for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
              grad_02[uVar9] = 0.0;
            }
            pRVar10 = grad;
            for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
              if (-1 < pRVar5->global[lVar8]) {
                scalar[lVar8] = *pRVar10;
              }
              pRVar10 = pRVar10 + 3;
            }
            uVar7 = ref_recon_l2_projection_grad(ref_grid,scalar,grad_00);
            if (uVar7 == 0) {
              pRVar10 = grad + 1;
              uVar12 = 0;
              uVar9 = (ulong)(uint)pRVar5->max;
              if (pRVar5->max < 1) {
                uVar9 = uVar12;
              }
              for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
                if (-1 < pRVar5->global[uVar12]) {
                  scalar[uVar12] = *pRVar10;
                }
                pRVar10 = pRVar10 + 3;
              }
              uVar7 = ref_recon_l2_projection_grad(ref_grid,scalar,grad_01);
              if (uVar7 == 0) {
                pRVar10 = grad + 2;
                uVar12 = 0;
                uVar9 = (ulong)(uint)pRVar5->max;
                if (pRVar5->max < 1) {
                  uVar9 = uVar12;
                }
                for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
                  if (-1 < pRVar5->global[uVar12]) {
                    scalar[uVar12] = *pRVar10;
                  }
                  pRVar10 = pRVar10 + 3;
                }
                uVar7 = ref_recon_l2_projection_grad(ref_grid,scalar,grad_02);
                if (uVar7 == 0) {
                  lVar14 = 0;
                  uVar7 = pRVar5->max;
                  if (pRVar5->max < 1) {
                    uVar7 = 0;
                  }
                  for (lVar8 = 0; (ulong)uVar7 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
                    if (-1 < *(long *)((long)pRVar5->global + lVar14)) {
                      *(undefined8 *)((long)metric + lVar8 * 2) =
                           *(undefined8 *)((long)grad_00 + lVar8);
                      pdVar1 = (double *)((long)grad_00 + lVar8 + 8);
                      dVar6 = pdVar1[1];
                      dVar3 = *(double *)((long)grad_02 + lVar8);
                      pdVar2 = (double *)((long)metric + lVar8 * 2 + 8);
                      *pdVar2 = (*(double *)((long)grad_01 + lVar8) + *pdVar1) * 0.5;
                      pdVar2[1] = (dVar3 + dVar6) * 0.5;
                      *(undefined8 *)((long)metric + lVar8 * 2 + 0x18) =
                           *(undefined8 *)((long)grad_01 + lVar8 + 8);
                      *(double *)((long)metric + lVar8 * 2 + 0x20) =
                           (*(double *)((long)grad_01 + lVar8 + 0x10) +
                           *(double *)((long)grad_02 + lVar8 + 8)) * 0.5;
                      *(undefined8 *)((long)metric + lVar8 * 2 + 0x28) =
                           *(undefined8 *)((long)grad_02 + lVar8 + 0x10);
                    }
                    lVar14 = lVar14 + 8;
                  }
                  free(grad_02);
                  free(grad_01);
                  free(grad_00);
                  free(scalar);
                  uVar7 = ref_recon_abs_value_hessian(ref_grid,metric);
                  if (uVar7 == 0) {
                    uVar7 = ref_recon_roundoff_limit(metric,ref_grid);
                    if (uVar7 == 0) {
                      uVar7 = ref_metric_local_scale(metric,ref_grid,p_norm);
                      if (uVar7 == 0) {
                        uVar7 = ref_metric_gradation_at_complexity
                                          (metric,ref_grid,gradation,target_complexity);
                        if (uVar7 == 0) {
                          return 0;
                        }
                        uVar9 = (ulong)uVar7;
                        pcVar15 = "gradation at complexity";
                        uVar11 = 0x9bc;
                      }
                      else {
                        uVar9 = (ulong)uVar7;
                        pcVar15 = "local scale lp norm";
                        uVar11 = 0x9b9;
                      }
                    }
                    else {
                      uVar9 = (ulong)uVar7;
                      pcVar15 = "floor metric eigenvalues based on grid size and solution jitter";
                      uVar11 = 0x9b8;
                    }
                  }
                  else {
                    uVar9 = (ulong)uVar7;
                    pcVar15 = "abs";
                    uVar11 = 0x9b5;
                  }
                }
                else {
                  uVar9 = (ulong)uVar7;
                  pcVar15 = "gradz";
                  uVar11 = 0x9a4;
                }
              }
              else {
                uVar9 = (ulong)uVar7;
                pcVar15 = "grady";
                uVar11 = 0x9a0;
              }
            }
            else {
              uVar9 = (ulong)uVar7;
              pcVar15 = "gradx";
              uVar11 = 0x99c;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar11,"ref_metric_multigrad",uVar9,pcVar15);
            return (REF_STATUS)uVar9;
          }
          pcVar15 = "malloc gradz of REF_DBL NULL";
          uVar11 = 0x999;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar11
           ,"ref_metric_multigrad",pcVar15);
    RVar13 = 2;
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_metric_multigrad(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *grad, REF_INT p_norm,
                                        REF_DBL gradation,
                                        REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL *dsdx, *gradx, *grady, *gradz;
  ref_malloc_init(dsdx, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradx, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grady, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradz, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  i = 0;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradx), "gradx");

  i = 1;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, grady), "grady");

  i = 2;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradz), "gradz");

  /* average off-diagonals */
  each_ref_node_valid_node(ref_node, node) {
    metric[0 + 6 * node] = gradx[0 + 3 * node];
    metric[1 + 6 * node] = 0.5 * (gradx[1 + 3 * node] + grady[0 + 3 * node]);
    metric[2 + 6 * node] = 0.5 * (gradx[2 + 3 * node] + gradz[0 + 3 * node]);
    metric[3 + 6 * node] = grady[1 + 3 * node];
    metric[4 + 6 * node] = 0.5 * (grady[2 + 3 * node] + gradz[1 + 3 * node]);
    metric[5 + 6 * node] = gradz[2 + 3 * node];
  }

  ref_free(gradz);
  ref_free(grady);
  ref_free(gradx);
  ref_free(dsdx);

  RSS(ref_recon_abs_value_hessian(ref_grid, metric), "abs");

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}